

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_impl.cpp
# Opt level: O2

void __thiscall
ear::dsp::block_convolver_impl::BlockConvolver::BlockConvolver
          (BlockConvolver *this,shared_ptr<ear::dsp::block_convolver_impl::Context> *ctx,
          size_t num_blocks)

{
  bool bVar1;
  allocator_type local_79;
  ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_> *local_78;
  ZeroTrack<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *local_70;
  ZeroTrack<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *local_68;
  ZeroTrack<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *local_60;
  vector<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>,_std::allocator<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>_>_>
  *local_58;
  unique_ptr<ear::FFTWorkBuf,_std::default_delete<ear::FFTWorkBuf>_> *local_50;
  value_type local_48;
  
  std::__shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2> *)
               this,&ctx->
                     super___shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2>
              );
  (*((((ctx->super___shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr)->fft).super___shared_ptr<ear::FFTPlan<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_FFTPlan[2])(&this->fft_work_buf);
  this->num_blocks = num_blocks;
  local_48.
  super___shared_ptr<const_ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_48.
  super___shared_ptr<const_ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50 = &this->fft_work_buf;
  std::
  vector<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>,_std::allocator<std::shared_ptr<const_ear::dsp::block_convolver_impl::Filter>_>_>
  ::vector(&this->filter_queue,num_blocks + 1,&local_48,&local_79);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.
              super___shared_ptr<const_ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_60 = &this->last_tail;
  (this->spectra_queue_new).
  super__Vector_base<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>,_std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->spectra_ofs = 0;
  (this->spectra_queue_new).
  super__Vector_base<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>,_std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spectra_queue_new).
  super__Vector_base<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>,_std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->spectra_queue_old).
  super__Vector_base<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>,_std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->spectra_queue_old).
  super__Vector_base<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>,_std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->filter_ofs = 0;
  (this->spectra_queue_old).
  super__Vector_base<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>,_std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,__1,_1,_0,__1,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58 = &this->filter_queue;
  ZeroTrack<Eigen::Matrix<float,-1,1,0,-1,1>>::ZeroTrack<unsigned_long_const&>
            ((ZeroTrack<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_60,
             &((ctx->
               super___shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->block_size);
  local_68 = &this->current_td_old;
  ZeroTrack<Eigen::Matrix<float,-1,1,0,-1,1>>::ZeroTrack<unsigned_long_const&>
            ((ZeroTrack<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_68,
             &((ctx->
               super___shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->td_size);
  local_70 = &this->current_td_new;
  ZeroTrack<Eigen::Matrix<float,-1,1,0,-1,1>>::ZeroTrack<unsigned_long_const&>
            ((ZeroTrack<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_70,
             &((ctx->
               super___shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->td_size);
  local_78 = &this->multiply_out;
  ZeroTrack<Eigen::Matrix<std::complex<float>,-1,1,0,-1,1>>::ZeroTrack<unsigned_long_const&>
            ((ZeroTrack<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>> *)local_78,
             &((ctx->
               super___shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->fd_size);
  ZeroTrack<Eigen::Matrix<float,-1,1,0,-1,1>>::ZeroTrack<unsigned_long_const&>
            ((ZeroTrack<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->out_td,
             &((ctx->
               super___shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->td_size);
  while (bVar1 = num_blocks != 0, num_blocks = num_blocks - 1, bVar1) {
    std::
    vector<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,-1,1,0,-1,1>>,std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,-1,1,0,-1,1>>>>
    ::emplace_back<unsigned_long_const&>
              ((vector<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>>,std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>>>>
                *)&this->spectra_queue_old,
               &((ctx->
                 super___shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->fd_size);
    std::
    vector<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,-1,1,0,-1,1>>,std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,-1,1,0,-1,1>>>>
    ::emplace_back<unsigned_long_const&>
              ((vector<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>>,std::allocator<ear::dsp::block_convolver_impl::BlockConvolver::ZeroTrack<Eigen::Matrix<std::complex<float>,_1,1,0,_1,1>>>>
                *)&this->spectra_queue_new,
               &((ctx->
                 super___shared_ptr<ear::dsp::block_convolver_impl::Context,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->fd_size);
  }
  return;
}

Assistant:

BlockConvolver::BlockConvolver(const std::shared_ptr<Context> &ctx,
                                     size_t num_blocks)
          : ctx(ctx),
            fft_work_buf(ctx->fft->alloc_workbuf()),
            num_blocks(num_blocks),
            filter_queue(num_blocks + 1, NULL),
            filter_ofs(0),
            spectra_ofs(0),
            last_tail(ctx->block_size),
            current_td_old(ctx->td_size),
            current_td_new(ctx->td_size),
            multiply_out(ctx->fd_size),
            out_td(ctx->td_size) {
        for (size_t i = 0; i < num_blocks; i++) {
          spectra_queue_old.emplace_back(ctx->fd_size);
          spectra_queue_new.emplace_back(ctx->fd_size);
        }
      }